

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O2

wchar_t cdeque_pop_front(cdeque *d,void **value)

{
  uint16_t uVar1;
  ushort uVar2;
  wchar_t wVar3;
  
  if (value == (void **)0x0 || d == (cdeque *)0x0) {
    wVar3 = L'\x02';
  }
  else {
    uVar1 = d->size;
    if (uVar1 != 0) {
      uVar2 = d->beg_pos;
      *value = (void *)d->arr[uVar2];
      d->beg_pos = uVar2 + 1 & d->cap_mask;
      d->size = uVar1 - 1;
      return L'\0';
    }
    wVar3 = L'\x03';
  }
  return wVar3;
}

Assistant:

static int cdeque_pop_front(struct cdeque* d, void** value) {
	if(!d || !value)
		return CDE_PARAM;

	if(d->size == 0)
		return CDE_OUT_OF_BOUNDS;

	cdeque_pop_front_fast(d, value);
	return CDE_OK;
}